

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

value_type * __thiscall
FadBinaryMul<Fad<Fad<double>_>,_FadExpr<FadBinaryAdd<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>::val
          (value_type *__return_storage_ptr__,
          FadBinaryMul<Fad<Fad<double>_>,_FadExpr<FadBinaryAdd<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>
          *this)

{
  double dVar1;
  uint uVar2;
  Fad<Fad<double>_> *pFVar3;
  uint uVar4;
  double *pdVar5;
  double *pdVar6;
  ulong uVar7;
  double *pdVar8;
  double *pdVar9;
  value_type local_48;
  
  pFVar3 = this->left_;
  FadBinaryAdd<Fad<Fad<double>_>,_Fad<Fad<double>_>_>::val(&local_48,&this->right_->fadexpr_);
  dVar1 = (pFVar3->val_).val_;
  __return_storage_ptr__->val_ = dVar1 * local_48.val_;
  uVar2 = (pFVar3->val_).dx_.num_elts;
  uVar4 = local_48.dx_.num_elts;
  if (local_48.dx_.num_elts < (int)uVar2) {
    uVar4 = uVar2;
  }
  (__return_storage_ptr__->dx_).num_elts = 0;
  (__return_storage_ptr__->dx_).ptr_to_data = (double *)0x0;
  if ((int)uVar4 < 1) {
    __return_storage_ptr__->defaultVal = 0.0;
  }
  else {
    (__return_storage_ptr__->dx_).num_elts = uVar4;
    pdVar5 = (double *)operator_new__((ulong)uVar4 * 8);
    (__return_storage_ptr__->dx_).ptr_to_data = pdVar5;
    __return_storage_ptr__->defaultVal = 0.0;
    pdVar6 = (pFVar3->val_).dx_.ptr_to_data;
    uVar7 = 0;
    do {
      pdVar8 = pdVar6;
      if (uVar2 == 0) {
        pdVar8 = &(pFVar3->val_).defaultVal;
      }
      pdVar9 = local_48.dx_.ptr_to_data;
      if (local_48.dx_.num_elts == 0) {
        pdVar9 = &local_48.defaultVal;
      }
      pdVar5[uVar7] = *pdVar8 * local_48.val_ + *pdVar9 * dVar1;
      uVar7 = uVar7 + 1;
      local_48.dx_.ptr_to_data = local_48.dx_.ptr_to_data + 1;
      pdVar6 = pdVar6 + 1;
    } while (uVar4 != uVar7);
  }
  Fad<double>::~Fad(&local_48);
  return __return_storage_ptr__;
}

Assistant:

const value_type val() const {return left_.val() * right_.val() ;}